

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O1

void ewmh_update_desktop_viewport(natwm_state *state,monitor_list *list)

{
  int iVar1;
  ulong uVar2;
  monitor *monitor;
  xcb_ewmh_connection_t *pxVar3;
  long lVar4;
  xcb_rectangle_t xVar5;
  node *pnVar6;
  int *piVar7;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uStack_40 = 0x1081bd;
  uVar2 = list->monitors->size;
  lVar4 = -(uVar2 * 8 + 0xf & 0xfffffffffffffff0);
  pnVar6 = list->monitors->head;
  if (pnVar6 != (node *)0x0) {
    piVar7 = (int *)((long)&uStack_40 + lVar4 + 4);
    do {
      monitor = (monitor *)pnVar6->data;
      *(undefined8 *)((long)&uStack_48 + lVar4) = 0x1081f0;
      xVar5 = monitor_get_offset_rect(monitor);
      piVar7[-1] = (int)xVar5.x;
      *piVar7 = xVar5._0_4_ >> 0x10;
      pnVar6 = pnVar6->next;
      piVar7 = piVar7 + 2;
    } while (pnVar6 != (node *)0x0);
  }
  pxVar3 = state->ewmh;
  iVar1 = state->screen_num;
  *(undefined8 *)((long)&uStack_48 + lVar4) = 0x10821c;
  xcb_ewmh_set_desktop_viewport(pxVar3,iVar1,uVar2 & 0xffffffff,(long)&uStack_40 + lVar4);
  return;
}

Assistant:

void ewmh_update_desktop_viewport(const struct natwm_state *state, const struct monitor_list *list)
{
        size_t num_monitors = list->monitors->size;
        xcb_ewmh_coordinates_t viewports[num_monitors];
        size_t index = 0;

        LIST_FOR_EACH(list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;
                xcb_rectangle_t rect = monitor_get_offset_rect(monitor);

                viewports[index].x = (uint32_t)rect.x;
                viewports[index].y = (uint32_t)rect.y;

                ++index;
        }

        xcb_ewmh_set_desktop_viewport(
                state->ewmh, state->screen_num, (uint32_t)num_monitors, viewports);
}